

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

void __thiscall QSizeGrip::QSizeGrip(QSizeGrip *this,QWidget *parent)

{
  long lVar1;
  QSizeGripPrivate *this_00;
  QSizeGripPrivate *this_01;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QSizeGripPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSizeGripPrivate *)operator_new(0x298);
  QSizeGripPrivate::QSizeGripPrivate(this_00);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x67ff7d);
  QWidget::QWidget(in_RDI,in_RSI,(QWidget *)this_00,(WindowFlags)f.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1a418;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QSizeGrip_00d1a5c8;
  this_01 = d_func((QSizeGrip *)0x67ffba);
  QSizeGripPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSizeGrip::QSizeGrip(QWidget * parent)
    : QWidget(*new QSizeGripPrivate, parent, { })
{
    Q_D(QSizeGrip);
    d->init();
}